

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSShape * js_new_shape2(JSContext *ctx,JSObject *proto,int hash_size,int prop_size)

{
  JSValue v;
  uint32_t uVar1;
  void *sh_alloc_00;
  uint32_t *puVar2;
  int in_ECX;
  int in_EDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSShape *sh;
  void *sh_alloc;
  JSRuntime *rt;
  JSShape *in_stack_ffffffffffffff98;
  JSContext *rt_00;
  undefined1 in_stack_ffffffffffffffa8 [16];
  size_t size;
  JSContext *in_stack_ffffffffffffffb8;
  JSShape *local_8;
  
  size = in_stack_ffffffffffffffa8._8_8_;
  if (in_RDI->rt->shape_hash_size < (in_RDI->rt->shape_hash_count + 1) * 2) {
    resize_shape_hash((JSRuntime *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8._12_4_);
  }
  rt_00 = in_RDI;
  get_shape_size((long)in_EDX,(long)in_ECX);
  sh_alloc_00 = js_malloc(in_stack_ffffffffffffffb8,size);
  if (sh_alloc_00 == (void *)0x0) {
    local_8 = (JSShape *)0x0;
  }
  else {
    local_8 = get_shape_from_alloc(sh_alloc_00,(long)in_EDX);
    (local_8->header).ref_count = 1;
    add_gc_object((JSRuntime *)rt_00,&in_stack_ffffffffffffff98->header,JS_GC_OBJ_TYPE_JS_OBJECT);
    if (in_RSI.ptr != (void *)0x0) {
      v.tag = -1;
      v.u.ptr = in_RSI.ptr;
      JS_DupValue(in_RDI,v);
    }
    local_8->proto = (JSObject *)in_RSI;
    puVar2 = prop_hash_end(local_8);
    memset(puVar2 + -(long)in_EDX,0,(long)in_EDX << 2);
    local_8->prop_hash_mask = in_EDX - 1;
    local_8->prop_size = in_ECX;
    local_8->prop_count = 0;
    local_8->deleted_prop_count = 0;
    uVar1 = shape_initial_hash((JSObject *)rt_00);
    local_8->hash = uVar1;
    local_8->is_hashed = '\x01';
    local_8->has_small_array_index = '\0';
    js_shape_hash_link((JSRuntime *)rt_00,in_stack_ffffffffffffff98);
  }
  return local_8;
}

Assistant:

static no_inline JSShape *js_new_shape2(JSContext *ctx, JSObject *proto,
                                        int hash_size, int prop_size)
{
    JSRuntime *rt = ctx->rt;
    void *sh_alloc;
    JSShape *sh;

    /* resize the shape hash table if necessary */
    if (2 * (rt->shape_hash_count + 1) > rt->shape_hash_size) {
        resize_shape_hash(rt, rt->shape_hash_bits + 1);
    }

    sh_alloc = js_malloc(ctx, get_shape_size(hash_size, prop_size));
    if (!sh_alloc)
        return NULL;
    sh = get_shape_from_alloc(sh_alloc, hash_size);
    sh->header.ref_count = 1;
    add_gc_object(rt, &sh->header, JS_GC_OBJ_TYPE_SHAPE);
    if (proto)
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, proto));
    sh->proto = proto;
    memset(prop_hash_end(sh) - hash_size, 0, sizeof(prop_hash_end(sh)[0]) *
           hash_size);
    sh->prop_hash_mask = hash_size - 1;
    sh->prop_size = prop_size;
    sh->prop_count = 0;
    sh->deleted_prop_count = 0;
    
    /* insert in the hash table */
    sh->hash = shape_initial_hash(proto);
    sh->is_hashed = TRUE;
    sh->has_small_array_index = FALSE;
    js_shape_hash_link(ctx->rt, sh);
    return sh;
}